

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

QMetaMethodBuilder __thiscall
QMetaObjectBuilder::addSignal(QMetaObjectBuilder *this,QByteArray *signature)

{
  QMetaObjectBuilderPrivate *pQVar1;
  pointer pQVar2;
  pointer pQVar3;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar4;
  QArrayDataPointer<char> QStack_b8;
  QMetaMethodBuilderPrivate local_a0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->d;
  pQVar2 = (pQVar1->methods).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pQVar3 = (pQVar1->methods).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  QByteArray::QByteArray((QByteArray *)&QStack_b8,"void",-1);
  QMetaMethodBuilderPrivate::QMetaMethodBuilderPrivate
            (&local_a0,Signal,signature,(QByteArray *)&QStack_b8,Public,0);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::
  emplace_back<QMetaMethodBuilderPrivate>(&pQVar1->methods,&local_a0);
  QMetaMethodBuilderPrivate::~QMetaMethodBuilderPrivate(&local_a0);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar4._8_8_ = ((long)pQVar3 - (long)pQVar2) / 0x68 & 0xffffffff;
    QVar4._mobj = this;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QMetaMethodBuilder QMetaObjectBuilder::addSignal(const QByteArray &signature)
{
    int index = int(d->methods.size());
    d->methods.push_back(QMetaMethodBuilderPrivate(QMetaMethod::Signal, signature,
                                                   QByteArray("void"), QMetaMethod::Public));
    return QMetaMethodBuilder(this, index);
}